

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

bool __thiscall
flatbuffers::python::PythonGenerator::generateEnums(PythonGenerator *this,string *one_file_code)

{
  bool bVar1;
  reference ppEVar2;
  ulong uVar3;
  string local_f8;
  undefined1 local_d8 [8];
  string mod;
  ImportMap imports;
  undefined1 local_58 [8];
  string enumcode;
  EnumDef *enum_def;
  __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
  local_28;
  const_iterator it;
  string *one_file_code_local;
  PythonGenerator *this_local;
  
  it._M_current = (EnumDef **)one_file_code;
  local_28._M_current =
       (EnumDef **)
       std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::begin
                 (&(((this->super_BaseGenerator).parser_)->enums_).vec);
  while( true ) {
    enum_def = (EnumDef *)
               std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::end
                         (&(((this->super_BaseGenerator).parser_)->enums_).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
                        *)&enum_def);
    if (!bVar1) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
              ::operator*(&local_28);
    enumcode.field_2._8_8_ = *ppEVar2;
    std::__cxx11::string::string((string *)local_58);
    GenEnum(this,(EnumDef *)enumcode.field_2._8_8_,(string *)local_58);
    if (((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api & 1U &
        *(byte *)(enumcode.field_2._8_8_ + 200) & 1) != 0) {
      GenUnionCreator(this,(EnumDef *)enumcode.field_2._8_8_,(string *)local_58);
    }
    if ((((((this->super_BaseGenerator).parser_)->opts).one_file & 1U) == 0) ||
       (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) != 0)) {
      std::
      set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::set((set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)((long)&mod.field_2 + 8));
      Namer::File<flatbuffers::EnumDef>
                ((string *)local_d8,&(this->namer_).super_Namer,(EnumDef *)enumcode.field_2._8_8_,
                 SuffixAndExtension);
      Namer::File<flatbuffers::EnumDef>
                (&local_f8,&(this->namer_).super_Namer,(EnumDef *)enumcode.field_2._8_8_,Suffix);
      bVar1 = SaveType(this,&local_f8,*(Namespace **)(enumcode.field_2._8_8_ + 0xa8),
                       (string *)local_58,(ImportMap *)((long)&mod.field_2 + 8),(string *)local_d8,
                       false);
      std::__cxx11::string::~string((string *)&local_f8);
      bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
      if (bVar1) {
        this_local._7_1_ = 0;
      }
      std::__cxx11::string::~string((string *)local_d8);
      std::
      set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~set((set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)((long)&mod.field_2 + 8));
      if (!bVar1) goto LAB_002ee5c5;
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &imports._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     "\n\n");
      std::__cxx11::string::operator+=
                ((string *)it._M_current,
                 (string *)&imports._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string
                ((string *)&imports._M_t._M_impl.super__Rb_tree_header._M_node_count);
LAB_002ee5c5:
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)local_58);
    if (bVar1) goto LAB_002ee605;
    __gnu_cxx::
    __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
    ::operator++(&local_28);
  }
  this_local._7_1_ = 1;
LAB_002ee605:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool generateEnums(std::string *one_file_code) const {
    for (auto it = parser_.enums_.vec.begin(); it != parser_.enums_.vec.end();
         ++it) {
      auto &enum_def = **it;
      std::string enumcode;
      GenEnum(enum_def, &enumcode);
      if (parser_.opts.generate_object_based_api & enum_def.is_union) {
        GenUnionCreator(enum_def, &enumcode);
      }

      if (parser_.opts.one_file && !enumcode.empty()) {
        *one_file_code += enumcode + "\n\n";
      } else {
        ImportMap imports;
        const std::string mod =
            namer_.File(enum_def, SkipFile::SuffixAndExtension);

        if (!SaveType(namer_.File(enum_def, SkipFile::Suffix),
                      *enum_def.defined_namespace, enumcode, imports, mod,
                      false))
          return false;
      }
    }
    return true;
  }